

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Plugin.cpp
# Opt level: O1

void __thiscall RenX::Plugin::~Plugin(Plugin *this)

{
  pointer *pppPVar1;
  pointer __dest;
  Core *pCVar2;
  vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_> *pvVar3;
  pointer ppPVar4;
  pointer __src;
  
  *(undefined ***)this = &PTR_think_0015c348;
  *(undefined ***)&this->field_0x8 = &PTR_OnRehash_0015c828;
  pCVar2 = getCore();
  pvVar3 = Core::getPlugins(pCVar2);
  ppPVar4 = (pvVar3->super__Vector_base<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  __dest = ppPVar4;
  do {
    if (ppPVar4 ==
        (pvVar3->super__Vector_base<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
LAB_0012801a:
      Jupiter::Plugin::~Plugin(&this->super_Plugin);
      return;
    }
    __src = __dest + 1;
    if (*ppPVar4 == this) {
      pCVar2 = getCore();
      pvVar3 = Core::getPlugins(pCVar2);
      ppPVar4 = (pvVar3->super__Vector_base<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      if (__src != ppPVar4) {
        memmove(__dest,__src,(long)ppPVar4 - (long)__src);
      }
      pppPVar1 = &(pvVar3->super__Vector_base<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppPVar1 = *pppPVar1 + -1;
      goto LAB_0012801a;
    }
    ppPVar4 = ppPVar4 + 1;
    __dest = __src;
  } while( true );
}

Assistant:

RenX::Plugin::~Plugin() {
	auto& renx_plugins = RenX::getCore()->getPlugins();
	for (auto itr = renx_plugins.begin(); itr != renx_plugins.end(); ++itr) {
		if (*itr == this) {
			RenX::getCore()->getPlugins().erase(itr);
			break;
		}
	}
}